

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

int SafeDecodeLiteralBlockSwitch(BrotliDecoderStateInternal *s)

{
  BrotliBitReader *br;
  byte bVar1;
  uint32_t uVar2;
  ulong uVar3;
  byte *pbVar4;
  size_t sVar5;
  byte *pbVar6;
  int iVar7;
  ulong uVar8;
  uint32_t uVar9;
  HuffmanCode *pHVar10;
  HuffmanCode *pHVar11;
  uint uVar12;
  uint32_t uVar13;
  size_t sVar14;
  uint uVar15;
  uint64_t uVar16;
  uint local_44;
  byte *local_40;
  uint local_34;
  
  uVar12 = s->num_block_types[0];
  if (uVar12 < 2) {
LAB_00105ea6:
    iVar7 = 0;
  }
  else {
    pHVar10 = s->block_type_trees;
    pHVar11 = s->block_len_trees;
    br = &s->br;
    uVar3 = (s->br).val_;
    uVar2 = (s->br).bit_pos_;
    pbVar4 = (s->br).next_in;
    sVar5 = (s->br).avail_in;
    uVar15 = uVar2 - 0x32;
    uVar8 = uVar3;
    uVar9 = uVar2;
    pbVar6 = pbVar4;
    sVar14 = sVar5;
    while (uVar15 < 0xf) {
      sVar14 = sVar14 - 1;
      if (sVar14 == 0xffffffffffffffff) {
        local_40 = (byte *)CONCAT44(local_40._4_4_,uVar12);
        iVar7 = SafeDecodeSymbol(pHVar10,br,&local_44);
        uVar12 = (uint)local_40;
        if (iVar7 != 0) goto LAB_00105cbe;
        goto LAB_00105ea6;
      }
      (s->br).val_ = uVar8 >> 8;
      uVar8 = uVar8 >> 8 | (ulong)*pbVar6 << 0x38;
      (s->br).val_ = uVar8;
      (s->br).bit_pos_ = uVar9 - 8;
      (s->br).avail_in = sVar14;
      (s->br).next_in = pbVar6 + 1;
      uVar15 = uVar9 - 0x3a;
      uVar9 = uVar9 - 8;
      pbVar6 = pbVar6 + 1;
    }
    uVar8 = uVar8 >> ((byte)uVar9 & 0x3f);
    pHVar10 = pHVar10 + (uVar8 & 0xff);
    uVar15 = (uint)pHVar10->bits;
    if (8 < uVar15) {
      uVar9 = uVar9 + 8;
      pHVar10 = pHVar10 + (ulong)pHVar10->value +
                          (ulong)((uint)(uVar8 >> 8) & 0xffffff & kBitMask[pHVar10->bits - 8] & 0x7f
                                 );
      uVar15 = (uint)pHVar10->bits;
    }
    (s->br).bit_pos_ = uVar15 + uVar9;
    local_44 = (uint)pHVar10->value;
LAB_00105cbe:
    local_40 = pbVar4;
    if (s->substate_read_block_length == BROTLI_STATE_READ_BLOCK_LENGTH_NONE) {
      uVar9 = (s->br).bit_pos_;
      if (uVar9 - 0x32 < 0xf) {
        sVar14 = (s->br).avail_in;
        uVar13 = uVar9;
        do {
          sVar14 = sVar14 - 1;
          if (sVar14 == 0xffffffffffffffff) {
            iVar7 = SafeDecodeSymbol(pHVar11,br,&local_34);
            if (iVar7 != 0) goto LAB_00105dc4;
            goto LAB_00105e87;
          }
          uVar8 = (s->br).val_;
          pbVar4 = (s->br).next_in;
          (s->br).val_ = uVar8 >> 8;
          uVar8 = (ulong)*pbVar4 << 0x38 | uVar8 >> 8;
          (s->br).val_ = uVar8;
          uVar9 = uVar13 - 8;
          (s->br).bit_pos_ = uVar9;
          (s->br).avail_in = sVar14;
          (s->br).next_in = pbVar4 + 1;
          uVar15 = uVar13 - 0x3a;
          uVar13 = uVar9;
        } while (uVar15 < 0xf);
      }
      else {
        uVar8 = br->val_;
      }
      uVar8 = uVar8 >> ((byte)uVar9 & 0x3f);
      pHVar11 = pHVar11 + (uVar8 & 0xff);
      uVar15 = (uint)pHVar11->bits;
      if (8 < uVar15) {
        uVar9 = uVar9 + 8;
        pHVar11 = pHVar11 + (ulong)pHVar11->value +
                            (ulong)((uint)(uVar8 >> 8) & 0xffffff & kBitMask[pHVar11->bits - 8] &
                                   0x7f);
        uVar15 = (uint)pHVar11->bits;
      }
      (s->br).bit_pos_ = uVar15 + uVar9;
      local_34 = (uint)pHVar11->value;
    }
    else {
      local_34 = s->block_length_index;
    }
LAB_00105dc4:
    bVar1 = kBlockLengthPrefixCode[local_34].nbits;
    uVar9 = (s->br).bit_pos_;
    uVar15 = 0x40 - uVar9;
    if (uVar15 < bVar1) {
      sVar14 = (s->br).avail_in;
      do {
        sVar14 = sVar14 - 1;
        if (sVar14 == 0xffffffffffffffff) {
          s->block_length_index = local_34;
LAB_00105e87:
          s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
          (s->br).val_ = uVar3;
          (s->br).bit_pos_ = uVar2;
          (s->br).next_in = local_40;
          (s->br).avail_in = sVar5;
          goto LAB_00105ea6;
        }
        uVar8 = (s->br).val_;
        pbVar4 = (s->br).next_in;
        (s->br).val_ = uVar8 >> 8;
        uVar16 = (ulong)*pbVar4 << 0x38 | uVar8 >> 8;
        (s->br).val_ = uVar16;
        uVar9 = uVar9 - 8;
        (s->br).bit_pos_ = uVar9;
        (s->br).avail_in = sVar14;
        (s->br).next_in = pbVar4 + 1;
        uVar15 = uVar15 + 8;
      } while (uVar15 < bVar1);
    }
    else {
      uVar16 = br->val_;
    }
    uVar15 = kBitMask[(uint)bVar1];
    (s->br).bit_pos_ = uVar9 + bVar1;
    s->block_length[0] =
         (uint)kBlockLengthPrefixCode[local_34].offset +
         ((uint)(uVar16 >> ((byte)uVar9 & 0x3f)) & uVar15);
    s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
    if (local_44 == 0) {
      local_44 = s->block_type_rb[0];
    }
    else if (local_44 == 1) {
      local_44 = s->block_type_rb[1] + 1;
    }
    else {
      local_44 = local_44 - 2;
    }
    uVar15 = 0;
    if (uVar12 <= local_44) {
      uVar15 = uVar12;
    }
    local_44 = local_44 - uVar15;
    s->block_type_rb[0] = s->block_type_rb[1];
    s->block_type_rb[1] = local_44;
    s->context_map_slice = s->context_map + local_44 * 0x40;
    s->trivial_literal_context =
         (uint)((s->trivial_literal_contexts[local_44 >> 5] >> (local_44 & 0x1f) & 1) != 0);
    s->literal_htree = (s->literal_hgroup).htrees[s->context_map[local_44 * 0x40]];
    s->context_lookup = "" + ((s->context_modes[local_44] & 3) << 9);
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

static BROTLI_INLINE BROTLI_BOOL DecodeBlockTypeAndLength(
    int safe, BrotliDecoderState* s, int tree_type) {
  uint32_t max_block_type = s->num_block_types[tree_type];
  const HuffmanCode* type_tree = &s->block_type_trees[
      tree_type * BROTLI_HUFFMAN_MAX_SIZE_258];
  const HuffmanCode* len_tree = &s->block_len_trees[
      tree_type * BROTLI_HUFFMAN_MAX_SIZE_26];
  BrotliBitReader* br = &s->br;
  uint32_t* ringbuffer = &s->block_type_rb[tree_type * 2];
  uint32_t block_type;
  if (max_block_type <= 1) {
    return BROTLI_FALSE;
  }

  /* Read 0..15 + 3..39 bits. */
  if (!safe) {
    block_type = ReadSymbol(type_tree, br);
    s->block_length[tree_type] = ReadBlockLength(len_tree, br);
  } else {
    BrotliBitReaderState memento;
    BrotliBitReaderSaveState(br, &memento);
    if (!SafeReadSymbol(type_tree, br, &block_type)) return BROTLI_FALSE;
    if (!SafeReadBlockLength(s, &s->block_length[tree_type], len_tree, br)) {
      s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
      BrotliBitReaderRestoreState(br, &memento);
      return BROTLI_FALSE;
    }
  }

  if (block_type == 1) {
    block_type = ringbuffer[1] + 1;
  } else if (block_type == 0) {
    block_type = ringbuffer[0];
  } else {
    block_type -= 2;
  }
  if (block_type >= max_block_type) {
    block_type -= max_block_type;
  }
  ringbuffer[0] = ringbuffer[1];
  ringbuffer[1] = block_type;
  return BROTLI_TRUE;
}